

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O0

int __thiscall FirewirePort::NumberOfUsers(FirewirePort *this)

{
  int iVar1;
  FILE *pFVar2;
  ostream *poVar3;
  void *pvVar4;
  char *pcVar5;
  int numberOfUsers;
  int local_34c;
  string local_348 [4];
  int numberOfLines;
  string result;
  char path [512];
  int status;
  FILE *fp;
  char command [256];
  FirewirePort *this_local;
  
  sprintf((char *)&fp,"lsof -t /dev/fw%d 2> /dev/null",(ulong)(uint)(this->super_BasePort).PortNum);
  pFVar2 = popen((char *)&fp,"r");
  if (pFVar2 == (FILE *)0x0) {
    poVar3 = std::operator<<((this->super_BasePort).outStr,
                             "FirewirePort::NumberOfUsers: unable to start lsof to count number of users on port "
                            );
    pvVar4 = (void *)std::ostream::operator<<(poVar3,(this->super_BasePort).PortNum);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::string(local_348);
  local_34c = 0;
  while( true ) {
    pcVar5 = fgets(result.field_2._M_local_buf + 8,0x200,pFVar2);
    if (pcVar5 == (char *)0x0) break;
    std::__cxx11::string::append((char *)local_348);
    local_34c = local_34c + 1;
  }
  iVar1 = pclose(pFVar2);
  if (iVar1 == -1) {
    poVar3 = std::operator<<((this->super_BasePort).outStr,
                             "FirewirePort::NumberOfUsers: error in pclose after lsof call");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  local_34c = local_34c + -1;
  if (1 < local_34c) {
    sprintf((char *)&fp,"lsof -R /dev/fw%d 2> /dev/null",(ulong)(uint)(this->super_BasePort).PortNum
           );
    pFVar2 = popen((char *)&fp,"r");
    if (pFVar2 == (FILE *)0x0) {
      poVar3 = std::operator<<((this->super_BasePort).outStr,
                               "FirewirePort::NumberOfUsers: unable to start lsof to count number of users on port "
                              );
      pvVar4 = (void *)std::ostream::operator<<(poVar3,(this->super_BasePort).PortNum);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::string::operator=(local_348,"");
    while( true ) {
      pcVar5 = fgets(result.field_2._M_local_buf + 8,0x200,pFVar2);
      if (pcVar5 == (char *)0x0) break;
      std::__cxx11::string::append((char *)local_348);
    }
    pclose(pFVar2);
    poVar3 = std::operator<<((this->super_BasePort).outStr,"FirewirePort::NumberOfUsers: found ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_34c);
    poVar3 = std::operator<<(poVar3," users");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Full lsof result:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,local_348);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_348);
  return local_34c;
}

Assistant:

int FirewirePort::NumberOfUsers(void)
{
    // try to count of many users on the handle
    char command[256];
    sprintf(command, "lsof -t /dev/fw%d 2> /dev/null", PortNum);
    FILE * fp;
    int status;
    char path[512];
    fp = popen(command, "r");
    if (fp == NULL) {
        outStr << "FirewirePort::NumberOfUsers: unable to start lsof to count number of users on port " << PortNum << std::endl;
    }
    std::string result;
    int numberOfLines = 0;
    while (fgets(path, 512, fp) != NULL) {
        result.append(path);
        numberOfLines++;
    }
    status = pclose(fp);

    if (status == -1) {
        outStr << "FirewirePort::NumberOfUsers: error in pclose after lsof call" << std::endl;
    }
    int numberOfUsers = numberOfLines - 1; // lsof itself
    if (numberOfUsers > 1) {
        sprintf(command, "lsof -R /dev/fw%d 2> /dev/null", PortNum);
        fp = popen(command, "r");
        if (fp == NULL) {
            outStr << "FirewirePort::NumberOfUsers: unable to start lsof to count number of users on port " << PortNum << std::endl;
        }
        result = "";   // clear result
        while (fgets(path, 512, fp) != NULL) {
            result.append(path);
        }
        status = pclose(fp);

        outStr << "FirewirePort::NumberOfUsers: found " << numberOfUsers << " users" << std::endl
               << "Full lsof result:" << std::endl
               << result << std::endl;
    }
    return numberOfUsers;
}